

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

void throwit(obj *obj,obj *ostack,long wep_mask,boolean twoweap,schar dx,schar dy,schar dz)

{
  undefined1 *puVar1;
  byte bVar2;
  boolean bVar3;
  schar sVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  obj *poVar9;
  monst *pmVar10;
  char *oldstr;
  undefined7 in_register_00000009;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  obj *in_stack_ffffffffffffff98;
  boolean obj_destroyed;
  int local_50;
  undefined4 local_4c;
  obj *local_48;
  int dmg;
  d_level *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,twoweap);
  bVar14 = true;
  local_48 = ostack;
  if ((u.umonnum != 0x9e && (u.uprops[0x1b].intrinsic == 0 && u.uprops[0x1c].intrinsic == 0)) &&
     ((youmonst.data)->mlet != '\x1c')) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017fd4a;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017fd45;
LAB_0017fd65:
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
        bVar14 = u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0;
      }
    }
    else {
LAB_0017fd45:
      if (ublindf != (obj *)0x0) {
LAB_0017fd4a:
        if (ublindf->oartifact == '\x1d') goto LAB_0017fd65;
      }
    }
  }
  uVar7 = *(uint *)&obj->field_0x4a;
  uVar6 = uVar7 | 0x2000000;
  *(uint *)&obj->field_0x4a = uVar6;
  if ((uVar7 & 1) == 0) {
LAB_0017fdd3:
    if ((((uVar6 >> 0x14 & 1) != 0) && (uVar7 = mt_random(), uVar7 * -0x49249249 < 0x24924925)) ||
       ((iVar8 = weapon_type(obj), u.weapon_skills[iVar8].skill == '\0' &&
        (uVar7 = mt_random(), uVar7 * -0x33333333 < 0x33333334)))) goto LAB_0017fe1a;
  }
  else {
    uVar7 = mt_random();
    if (0x24924924 < uVar7 * -0x49249249) {
      uVar6 = *(uint *)&obj->field_0x4a;
      goto LAB_0017fdd3;
    }
LAB_0017fe1a:
    if (u.dy != '\0' || u.dx != '\0') {
      if ((obj->oclass == '\r') || (obj->oclass == '\x02')) {
        cVar5 = objects[obj->otyp].oc_subtyp;
        if ((cVar5 < -0x18) ||
           ((uwep == (obj *)0x0 || -0x16 < cVar5 ||
            ((int)cVar5 + (int)objects[uwep->otyp].oc_subtyp != 0)))) goto LAB_0017fe96;
        pcVar13 = "%s!";
        pcVar11 = "misfire";
      }
      else {
LAB_0017fe96:
        pcVar13 = "%s as you throw it!";
        pcVar11 = "slip";
        if (((obj->field_0x4c & 0x10) == 0) && (bVar3 = throwing_weapon(obj), bVar3 == '\0'))
        goto LAB_0017ff46;
      }
      pcVar11 = Tobjnam(obj,pcVar11);
      pline(pcVar13,pcVar11);
      uVar7 = mt_random();
      dx = (char)uVar7 + (char)(uVar7 / 3) * -3 + -1;
      uVar7 = mt_random();
      dy = (char)(uVar7 % 3) + -1;
      bVar14 = true;
      if (dx == '\0' && dy == '\0') {
        uVar7 = mt_random();
        dz = -(uVar7 * -0x55555555 < 0x55555556) | 1;
        dx = '\0';
        dy = '\0';
      }
    }
  }
LAB_0017ff46:
  if ((((dx == '\0') && (dy == '\0')) && ('\0' < dz)) ||
     (iVar8 = calc_capacity(obj->owt), iVar8 < 2)) {
LAB_0017ffc3:
    if ((u._1052_1_ & 1) != 0) goto LAB_0018034e;
    if (dz != 0) {
      if ((dz < '\0') && (urole.malenum == 0x167)) {
        if ((obj->oartifact == '\x05') && (!bVar14)) {
          thrownobj = obj;
          pcVar11 = Tobjnam(obj,"hit");
          pcVar13 = ceiling((int)u.ux,(int)u.uy);
          pline("%s the %s and returns to your hand!",pcVar11,pcVar13);
          poVar9 = addinv(in_stack_ffffffffffffff98);
          encumber_msg();
          setuwep(poVar9);
          u.twoweap = (boolean)local_4c;
          thrownobj = (obj *)0x0;
          return;
        }
      }
      else {
        thrownobj = obj;
        if (-1 < dz) goto LAB_00180329;
      }
      thrownobj = obj;
      bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar3 == '\0') && ((u._1052_1_ & 2) == 0)) &&
         (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 == '\0')) {
        uVar7 = mt_random();
        toss_up(obj,local_48,(boolean)(uVar7 % 5));
        thrownobj = (obj *)0x0;
        return;
      }
LAB_00180329:
      hitfloor(obj,local_48,'\x01');
      thrownobj = (obj *)0x0;
      return;
    }
    if (((u._1052_1_ & 2) == 0) && (obj->otyp == 9)) {
      thrownobj = obj;
      bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar3 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))) {
        hurtle(-(int)dx,-(int)dy,1,'\x01');
      }
      pmVar10 = boomhit((int)dx,(int)dy);
      if (pmVar10 == &youmonst) {
        exercise(3,'\x01');
        poVar9 = addinv(in_stack_ffffffffffffff98);
        encumber_msg();
        if ((wep_mask != 0) && ((poVar9->owornmask & wep_mask) == 0)) {
          setworn(poVar9,wep_mask);
          u.twoweap = (boolean)local_4c;
        }
        thrownobj = (obj *)0x0;
        return;
      }
    }
    else {
      thrownobj = obj;
      sVar4 = acurrstr();
      local_50 = (int)(sVar4 / '\x02');
      uVar7 = 0x28;
      if ((long)obj->otyp == 0x216) {
        uVar7 = 100;
      }
      uVar6 = local_50 - obj->owt / uVar7;
      uVar7 = uVar6;
      if (((uball == obj) && (uVar7 = 1, u.ustuck == (monst *)0x0)) && (uVar7 = 5, (int)uVar6 < 5))
      {
        uVar7 = uVar6;
      }
      uVar6 = 1;
      if (1 < (int)uVar7) {
        uVar6 = uVar7;
      }
      cVar5 = obj->oclass;
      if (((cVar5 == '\r') || (cVar5 == '\x02')) &&
         ((byte)(objects[obj->otyp].oc_subtyp + 0x18U) < 3)) {
        if (((cVar5 == '\r') || (cVar5 == '\x02')) &&
           ((uwep != (obj *)0x0 &&
            ((int)objects[obj->otyp].oc_subtyp + (int)objects[uwep->otyp].oc_subtyp == 0)))) {
          uVar6 = uVar6 + 1;
        }
        else {
          uVar6 = uVar6 >> (cVar5 != '\r');
        }
      }
      local_38 = &u.uz;
      bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar3 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))) {
        local_50 = local_50 - uVar6;
        if (local_50 < 2) {
          local_50 = 1;
        }
        uVar6 = uVar6 - local_50;
        if ((int)uVar6 < 2) {
          uVar6 = 1;
        }
      }
      uVar7 = 0x14;
      if (obj->otyp != 0x214) {
        if (obj->oartifact == '\x05') {
          uVar7 = uVar6 + 1 >> 1;
        }
        else {
          uVar7 = 1;
          if (u.utraptype != 4) {
            uVar7 = uVar6;
          }
          if (u.utrap == 0) {
            uVar7 = uVar6;
          }
          if (uball != obj) {
            uVar7 = uVar6;
          }
        }
      }
      if ((u._1052_1_ & 2) != 0) {
        uVar7 = 1;
      }
      obj_destroyed = '\0';
      pmVar10 = beam_hit((int)dx,(int)dy,uVar7,1,(_func_int_monst_ptr_obj_ptr *)0x0,
                         (_func_int_obj_ptr_obj_ptr *)0x0,obj,&obj_destroyed);
      bVar3 = on_level(local_38,&dungeon_topology.d_air_level);
      if ((((bVar3 != '\0') || (u.uprops[0x12].intrinsic != 0)) || (u.uprops[0x12].extrinsic != 0))
         || ((youmonst.data)->mlet == '\x05')) {
        hurtle(-(int)dx,-(int)dy,local_50,'\x01');
      }
      if (obj_destroyed != '\0') {
        return;
      }
    }
    if (pmVar10 != (monst *)0x0) goto LAB_0018036e;
    pmVar10 = (monst *)0x0;
  }
  else {
    if (u.umonnum == u.umonster) {
      if ((u.uhp < 10) && (iVar8 = u.uhp, u.uhp != u.uhpmax)) goto LAB_0017ffa0;
      goto LAB_0017ffc3;
    }
    if ((4 < u.mh) || (iVar8 = u.mh, u.mh == u.mhmax)) goto LAB_0017ffc3;
LAB_0017ffa0:
    if ((obj->owt <= (uint)(iVar8 * 2)) ||
       (bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar3 != '\0')) goto LAB_0017ffc3;
    pcVar11 = xname(obj);
    the(pcVar11);
    dy = '\0';
    pline("You have so little stamina, %s drops from your grasp.");
    exercise(4,'\0');
    dx = '\0';
    thrownobj = obj;
    if ((u._1052_1_ & 1) == 0) goto LAB_00180329;
LAB_0018034e:
    bhitpos.x = (u.ustuck)->mx;
    bhitpos.y = (u.ustuck)->my;
    pmVar10 = u.ustuck;
    thrownobj = obj;
LAB_0018036e:
    if ((((pmVar10->field_0x63 & 2) != 0) && (obj->where == '\x04')) &&
       ((monst *)(obj->v).v_nexthere == pmVar10)) {
      thrownobj = (obj *)0x0;
      return;
    }
    snuff_candle(obj);
    notonhead = true;
    if (bhitpos.x == pmVar10->mx) {
      notonhead = bhitpos.y != pmVar10->my;
    }
    iVar8 = thitmonst(pmVar10,obj,local_48);
    pmVar10 = level->monsters[bhitpos.x][bhitpos.y];
    if ((pmVar10 == (monst *)0x0) || ((*(uint *)&pmVar10->field_0x60 >> 9 & 1) != 0)) {
      pmVar10 = (monst *)0x0;
    }
    else if ((*(uint *)&pmVar10->field_0x60 >> 0x19 & 1) != 0) {
      cVar5 = inside_shop(level,u.ux,u.uy);
      if (cVar5 != '\0') {
        pcVar11 = in_rooms(level,pmVar10->mx,pmVar10->my,0x12);
        pcVar11 = strchr(pcVar11,(int)u.ushops[0]);
        if (pcVar11 != (char *)0x0) goto LAB_0018044e;
      }
      hot_pursuit(pmVar10);
    }
LAB_0018044e:
    if (iVar8 != 0) {
      return;
    }
  }
  if ((u._1052_1_ & 1) != 0) {
    if (uball != obj) {
      mpickobj(u.ustuck,obj);
      return;
    }
    return;
  }
  if (((obj->oartifact != '\x05') || (urole.malenum != 0x167)) ||
     (uVar7 = mt_random(), (uVar7 * -0x3d70a3d7 >> 2 | uVar7 * 0x40000000) < 0x28f5c29)) {
    bVar2 = level->locations[bhitpos.x][bhitpos.y].typ;
    if ((((1 < (byte)(bVar2 - 0x25)) && (3 < bVar2 - 0x11)) && (bVar2 != 0x23)) &&
       (bVar3 = breaktest(obj), bVar3 != '\0')) {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
        iVar8 = (int)obj->otyp;
      }
      else {
        iVar8 = display_rng(0x219);
        iVar8 = iVar8 + 1;
      }
      tmp_at(-4,iVar8 + 1);
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      tmp_at(-6,0);
      breakmsg(obj,viz_array[bhitpos.y][bhitpos.x] & 2);
      breakobj(obj,bhitpos.x,bhitpos.y,'\x01','\x01');
      return;
    }
    bVar3 = flooreffects(obj,(int)bhitpos.x,(int)bhitpos.y,"fall");
    if (bVar3 != '\0') {
      return;
    }
    obj_no_longer_held(obj);
    bVar3 = detonate_obj(obj,local_48,uwep,(int)bhitpos.x,(int)bhitpos.y,'\x01');
    if (bVar3 != '\0') {
      return;
    }
    if (pmVar10 == (monst *)0x0) {
      snuff_candle(obj);
      bVar3 = ship_object(obj,bhitpos.x,bhitpos.y,'\0');
      if (bVar3 != '\0') {
        thrownobj = (obj *)0x0;
        return;
      }
    }
    else {
      if ((((pmVar10->field_0x63 & 2) != 0) && ((byte)(obj->oclass | 4U) == 6)) &&
         (objects[obj->otyp].oc_subtyp == '\x04')) {
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
          pcVar11 = Monnam(pmVar10);
          pcVar13 = xname(obj);
          pcVar13 = the(pcVar13);
          pline("%s snatches up %s.",pcVar11,pcVar13);
        }
        if (u.ushops[0] != '\0') {
          check_shop_obj(obj,bhitpos.x,bhitpos.y,'\0');
        }
        mpickobj(pmVar10,obj);
        thrownobj = (obj *)0x0;
        return;
      }
      snuff_candle(obj);
    }
    thrownobj = (obj *)0x0;
    place_object(obj,level,(int)bhitpos.x,(int)bhitpos.y);
    if ((u.ushops[0] != '\0') && (uball != obj)) {
      check_shop_obj(obj,bhitpos.x,bhitpos.y,'\0');
    }
    stackobj(in_stack_ffffffffffffff98);
    if (uball == obj) {
      drop_ball(bhitpos.x,bhitpos.y,dx,dy);
    }
    if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
      newsym((int)bhitpos.x,(int)bhitpos.y);
    }
    bVar3 = obj_sheds_light(obj);
    if (bVar3 != '\0') {
      vision_full_recalc = '\x01';
    }
    puVar1 = &level->locations[bhitpos.x][bhitpos.y].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffb;
    bVar2 = level->locations[bhitpos.x][bhitpos.y].typ;
    if (1 < (byte)(bVar2 - 0x25)) {
      if (bVar2 - 0x11 < 4) {
        return;
      }
      if (bVar2 != 0x23) {
        container_impact_dmg(obj);
        return;
      }
      return;
    }
    return;
  }
  sho_obj_return_to_u(obj,dx,dy);
  if ((!bVar14) &&
     (uVar7 = mt_random(), 0x28f5c28 < (uVar7 * -0x3d70a3d7 >> 2 | uVar7 * 0x40000000))) {
    pcVar11 = Tobjnam(obj,"return");
    pline("%s to your hand!",pcVar11);
    poVar9 = addinv(in_stack_ffffffffffffff98);
    encumber_msg();
    setuwep(poVar9);
    u.twoweap = (boolean)local_4c;
    if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
      thrownobj = (obj *)0x0;
      return;
    }
    newsym((int)bhitpos.x,(int)bhitpos.y);
    thrownobj = (obj *)0x0;
    return;
  }
  uVar7 = mt_random();
  uVar6 = uVar7 & 1;
  dmg = uVar6;
  if ((uVar7 & 1) != 0) {
    uVar7 = mt_random();
    dmg = uVar7 % 3 + uVar6 + 1;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001807a4;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018079b;
      pcVar11 = "%s back toward you, hitting your %s!";
LAB_00180971:
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018099d;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00180998;
      pcVar13 = "fly";
    }
    else {
LAB_0018079b:
      if (ublindf == (obj *)0x0) {
        pcVar11 = "%s your %s!";
      }
      else {
LAB_001807a4:
        pcVar11 = "%s your %s!";
        if (ublindf->oartifact == '\x1d') {
          pcVar11 = "%s back toward you, hitting your %s!";
        }
      }
      if (u.uprops[0x1e].intrinsic == 0) goto LAB_00180971;
LAB_00180998:
      if (ublindf == (obj *)0x0) {
        pcVar13 = "hit";
      }
      else {
LAB_0018099d:
        pcVar13 = "hit";
        if (ublindf->oartifact == '\x1d') {
          pcVar13 = "fly";
        }
      }
    }
    pcVar13 = Tobjnam(obj,pcVar13);
    pcVar12 = body_part(0);
    pline(pcVar11,pcVar13,pcVar12);
    artifact_hit((monst *)0x0,&youmonst,obj,local_48,'\x01',&dmg,0);
    iVar8 = dmg;
    pcVar11 = xname(obj);
    bVar3 = obj_is_pname(obj);
    losehp(iVar8,pcVar11,(uint)(bVar3 != '\0'));
    goto LAB_00180a33;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018060f;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00180606;
    pcVar11 = "%s back to you, landing %s your %s.";
LAB_001808b9:
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001808dc;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001808d7;
LAB_001808e2:
    pcVar13 = Tobjnam(obj,"return");
  }
  else {
LAB_00180606:
    if (ublindf == (obj *)0x0) {
      pcVar11 = "%s lands %s your %s.";
    }
    else {
LAB_0018060f:
      pcVar11 = "%s lands %s your %s.";
      if (ublindf->oartifact == '\x1d') {
        pcVar11 = "%s back to you, landing %s your %s.";
      }
    }
    if (u.uprops[0x1e].intrinsic == 0) goto LAB_001808b9;
LAB_001808d7:
    if (ublindf != (obj *)0x0) {
LAB_001808dc:
      if (ublindf->oartifact == '\x1d') goto LAB_001808e2;
    }
    pcVar13 = "Something";
  }
  if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
    pcVar12 = "at";
    if ((youmonst.data)->mlet == '\x05') {
      pcVar12 = "beneath";
    }
  }
  else {
    pcVar12 = "beneath";
  }
  oldstr = body_part(5);
  makeplural(oldstr);
  pline(pcVar11,pcVar13,pcVar12);
LAB_00180a33:
  bVar3 = ship_object(obj,u.ux,u.uy,'\0');
  if (bVar3 == '\0') {
    dropy(obj);
  }
  thrownobj = (obj *)0x0;
  return;
}

Assistant:

void throwit(struct obj *obj,
	     struct obj *ostack,
	     long wep_mask,  /* used to re-equip returning boomerang */
	     boolean twoweap, /* used to restore twoweapon mode if wielded weapon returns */
	     schar dx, schar dy, schar dz)
{
	struct monst *mon;
	int range, urange;
	boolean impaired = (Confusion || Stunned || Blind ||
			   Hallucination || Fumbling);

	obj->was_thrown = 1;
	/* Split slip chance of cursed and greased objects; one that is both
	 * has a 1-(6/7)^2 (or 13/49, or ~26%) chance of slipping.
	 * Also, restricted throwing has a 20% chance of slipping
	 * to discourage role-/race-atypical fighting.
	 */
	if (((obj->cursed && rnf(1,7)) ||
	     (obj->greased && rnf(1,7)) ||
	     (P_SKILL(weapon_type(obj)) == P_ISRESTRICTED && rnf(1,5))) &&
	    (u.dx || u.dy)) {
	    boolean slipok = TRUE;
	    if (ammo_and_launcher(obj, uwep))
		pline("%s!", Tobjnam(obj, "misfire"));
	    else {
		/* only slip if it's greased or meant to be thrown */
		if (obj->greased || throwing_weapon(obj))
		    /* BUG: this message is grammatically incorrect if obj has
		       a plural name; greased gloves or boots for instance. */
		    pline("%s as you throw it!", Tobjnam(obj, "slip"));
		else slipok = FALSE;
	    }
	    if (slipok) {
		dx = rn2(3)-1;
		dy = rn2(3)-1;
		if (!dx && !dy)
		    dz = rnf(1,3) ? -1 : 1;
		impaired = TRUE;
	    }
	}

	if ((dx || dy || (dz < 1)) &&
	    calc_capacity((int)obj->owt) > SLT_ENCUMBER &&
	    (Upolyd ? (u.mh < 5 && u.mh != u.mhmax)
	     : (u.uhp < 10 && u.uhp != u.uhpmax)) &&
	    obj->owt > (unsigned)((Upolyd ? u.mh : u.uhp) * 2) &&
	    !Is_airlevel(&u.uz)) {
	    pline("You have so little stamina, %s drops from your grasp.",
		the(xname(obj)));
	    exercise(A_CON, FALSE);
	    dx = dy = 0;
	    dz = 1;
	}

	thrownobj = obj;

	if (u.uswallow) {
		mon = u.ustuck;
		bhitpos.x = mon->mx;
		bhitpos.y = mon->my;
	} else if (dz) {
	    if (dz < 0 && Role_if (PM_VALKYRIE) &&
		    obj->oartifact == ART_MJOLLNIR && !impaired) {
		pline("%s the %s and returns to your hand!",
		      Tobjnam(obj, "hit"), ceiling(u.ux,u.uy));
		obj = addinv(obj);
		encumber_msg();
		setuwep(obj);
		u.twoweap = twoweap;
	    } else if (dz < 0 && !Is_airlevel(&u.uz) &&
		    !Underwater && !Is_waterlevel(&u.uz)) {
		toss_up(obj, ostack, rn2(5));
	    } else {
		hitfloor(obj, ostack, TRUE);
	    }
	    thrownobj = NULL;
	    return;

	} else if (obj->otyp == BOOMERANG && !Underwater) {
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, 1, TRUE);
		mon = boomhit(dx, dy);
		if (mon == &youmonst) {		/* the thing was caught */
			exercise(A_DEX, TRUE);
			obj = addinv(obj);
			encumber_msg();
			if (wep_mask && !(obj->owornmask & wep_mask)) {
			    setworn(obj, wep_mask);
			    u.twoweap = twoweap;
			}
			thrownobj = NULL;
			return;
		}
	} else {
		boolean obj_destroyed;
		urange = (int)(ACURRSTR)/2;
		/* balls are easy to throw or at least roll */
		/* also, this insures the maximum range of a ball is greater
		 * than 1, so the effects from throwing attached balls are
		 * actually possible
		 */
		if (obj->otyp == HEAVY_IRON_BALL)
			range = urange - (int)(obj->owt/100);
		else
			range = urange - (int)(obj->owt/40);
		if (obj == uball) {
			if (u.ustuck) range = 1;
			else if (range >= 5) range = 5;
		}
		if (range < 1) range = 1;

		if (is_ammo(obj)) {
		    if (ammo_and_launcher(obj, uwep))
			range++;
		    else if (obj->oclass != GEM_CLASS)
			range /= 2;
		}

		if (Is_airlevel(&u.uz) || Levitation) {
		    /* action, reaction... */
		    urange -= range;
		    if (urange < 1) urange = 1;
		    range -= urange;
		    if (range < 1) range = 1;
		}

		if (obj->otyp == BOULDER)
		    range = 20;		/* you must be giant */
		else if (obj->oartifact == ART_MJOLLNIR)
		    range = (range + 1) / 2;	/* it's heavy */
		else if (obj == uball && u.utrap && u.utraptype == TT_INFLOOR)
		    range = 1;

		if (Underwater) range = 1;
		
		obj_destroyed = FALSE;
		mon = beam_hit(dx, dy, range, THROWN_WEAPON, NULL, NULL, obj,
			       &obj_destroyed);

		/* have to do this after bhit() so u.ux & u.uy are correct */
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, urange, TRUE);
		
		if (obj_destroyed) return;
	}

	if (mon) {
		boolean obj_gone;

		if (mon->isshk &&
		    obj->where == OBJ_MINVENT && obj->ocarry == mon) {
		    thrownobj = NULL;
		    return;		/* alert shk caught it */
		}
		snuff_candle(obj);
		notonhead = (bhitpos.x != mon->mx || bhitpos.y != mon->my);
		obj_gone = thitmonst(mon, obj, ostack);
		/* Monster may have been tamed; this frees old mon */
		mon = m_at(level, bhitpos.x, bhitpos.y);

		/* [perhaps this should be moved into thitmonst or hmon] */
		if (mon && mon->isshk &&
			(!inside_shop(level, u.ux, u.uy) ||
			 !strchr(in_rooms(level, mon->mx, mon->my, SHOPBASE), *u.ushops)))
		    hot_pursuit(mon);

		if (obj_gone) return;
	}

	if (u.uswallow) {
		/* ball is not picked up by monster */
		if (obj != uball) mpickobj(u.ustuck,obj);
	} else {
		/* the code following might become part of dropy() */
		if (obj->oartifact == ART_MJOLLNIR &&
			Role_if (PM_VALKYRIE) && rn2(100)) {
		    /* we must be wearing Gauntlets of Power to get here */
		    sho_obj_return_to_u(obj, dx, dy);	    /* display its flight */

		    if (!impaired && rn2(100)) {
			pline("%s to your hand!", Tobjnam(obj, "return"));
			obj = addinv(obj);
			encumber_msg();
			setuwep(obj);
			u.twoweap = twoweap;
			if (cansee(bhitpos.x, bhitpos.y))
			    newsym(bhitpos.x,bhitpos.y);
		    } else {
			int dmg = rn2(2);
			if (!dmg) {
			    pline(Blind ? "%s lands %s your %s." :
					"%s back to you, landing %s your %s.",
				  Blind ? "Something" : Tobjnam(obj, "return"),
				  Levitation ? "beneath" : "at",
				  makeplural(body_part(FOOT)));
			} else {
			    dmg += rnd(3);
			    pline(Blind ? "%s your %s!" :
					"%s back toward you, hitting your %s!",
				  Tobjnam(obj, Blind ? "hit" : "fly"),
				  body_part(ARM));
			    artifact_hit(NULL, &youmonst, obj, ostack, TRUE,
					 &dmg, 0);
			    losehp(dmg, xname(obj),
				obj_is_pname(obj) ? KILLED_BY : KILLED_BY_AN);
			}
			if (ship_object(obj, u.ux, u.uy, FALSE)) {
		    	    thrownobj = NULL;
			    return;
			}
			dropy(obj);
		    }
		    thrownobj = NULL;
		    return;
		}

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ) &&
			breaktest(obj)) {
		    tmp_at(DISP_OBJECT, dbuf_objid(obj));
		    tmp_at(bhitpos.x, bhitpos.y);
		    win_delay_output();
		    tmp_at(DISP_END, 0);
		    breakmsg(obj, cansee(bhitpos.x, bhitpos.y));
		    breakobj(obj, bhitpos.x, bhitpos.y, TRUE, TRUE);
		    return;
		}
		if (flooreffects(obj,bhitpos.x,bhitpos.y,"fall")) return;
		obj_no_longer_held(obj);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return;
		if (mon && mon->isshk && is_pick(obj)) {
		    if (cansee(bhitpos.x, bhitpos.y))
			pline("%s snatches up %s.",
			      Monnam(mon), the(xname(obj)));
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);
		    mpickobj(mon, obj);	/* may merge and free obj */
		    thrownobj = NULL;
		    return;
		}
		snuff_candle(obj);
		if (!mon && ship_object(obj, bhitpos.x, bhitpos.y, FALSE)) {
		    thrownobj = NULL;
		    return;
		}
		thrownobj = NULL;
		place_object(obj, level, bhitpos.x, bhitpos.y);
		if (*u.ushops && obj != uball)
		    check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);

		stackobj(obj);
		if (obj == uball)
		    drop_ball(bhitpos.x, bhitpos.y, dx, dy);
		if (cansee(bhitpos.x, bhitpos.y))
		    newsym(bhitpos.x,bhitpos.y);
		if (obj_sheds_light(obj))
		    vision_full_recalc = 1;

		/* Lead autoexplore back over thrown object if it's seen again.
		 * Technically the player may not see where it lands, but they
		 * could probably guess it anyway. */
		level->locations[bhitpos.x][bhitpos.y].mem_stepped = 0;

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ))
		    container_impact_dmg(obj);
	}
}